

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

double units::getPrefixMultiplier(char p)

{
  undefined3 in_register_00000039;
  double dVar1;
  
  dVar1 = 0.0;
  switch(CONCAT31(in_register_00000039,p)) {
  case 0x41:
  case 0x61:
    return 1e-18;
  case 0x42:
  case 0x47:
    return 1000000000.0;
  case 0x43:
  case 99:
    return 0.01;
  case 0x44:
  case 100:
    return 0.1;
  case 0x45:
    return 1e+18;
  case 0x46:
  case 0x66:
    return 1e-15;
  case 0x48:
  case 0x68:
    return 100.0;
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4e:
  case 0x4f:
  case 0x53:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x65:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6c:
  case 0x6f:
  case 0x73:
  case 0x74:
  case 0x76:
  case 0x77:
  case 0x78:
    break;
  case 0x4b:
  case 0x6b:
    return 1000.0;
  case 0x4d:
    return 1000000.0;
  case 0x50:
    return 1e+15;
  case 0x51:
    return 1e+30;
  case 0x52:
    return 1e+27;
  case 0x54:
    return 1000000000000.0;
  case 0x55:
  case 0x75:
    return 1e-06;
  case 0x59:
    return 1e+24;
  case 0x5a:
    return 1e+21;
  case 0x6d:
    return 0.001;
  case 0x6e:
    return 1e-09;
  case 0x70:
    return 1e-12;
  case 0x71:
    dVar1 = 1e-30;
    break;
  case 0x72:
    return 1e-27;
  case 0x79:
    return 1e-24;
  case 0x7a:
    return 1e-21;
  default:
    if (CONCAT31(in_register_00000039,p) == -0x4b) {
      return 1e-06;
    }
  }
  return dVar1;
}

Assistant:

static double getPrefixMultiplier(char p)
{
    switch (p) {
        case 'm':
            return precise::milli.multiplier();
        case 'k':
        case 'K':
            return precise::kilo.multiplier();
        case 'M':
            return precise::mega.multiplier();
        case 'u':
        case 'U':
        case '\xB5':  // latin-1 encoding "micro"
            return precise::micro.multiplier();
        case 'd':
        case 'D':
            return precise::deci.multiplier();
        case 'c':
        case 'C':
            return precise::centi.multiplier();
        case 'h':
        case 'H':
            return precise::hecto.multiplier();
        case 'n':
            return precise::nano.multiplier();
        case 'p':
            return precise::pico.multiplier();
        case 'G':
        case 'B':  // Billion
            return precise::giga.multiplier();
        case 'T':
            return precise::tera.multiplier();
        case 'f':
        case 'F':
            return precise::femto.multiplier();
        case 'E':
            return precise::exa.multiplier();
        case 'P':
            return precise::peta.multiplier();
        case 'Z':
            return precise::zetta.multiplier();
        case 'Y':
            return precise::yotta.multiplier();
        case 'y':
            return precise::yocto.multiplier();
        case 'a':
        case 'A':
            return precise::atto.multiplier();
        case 'z':
            return precise::zepto.multiplier();
        case 'R':
            return precise::ronna.multiplier();
        case 'r':
            return precise::ronto.multiplier();
        case 'Q':
            return precise::quetta.multiplier();
        case 'q':
            return precise::quecto.multiplier();
        default:
            return 0.0;
    }
}